

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::CompilationCompletionParallelTest::iterate(CompilationCompletionParallelTest *this)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  deUint64 dVar6;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  int i_4;
  int i;
  long lVar7;
  GLint completionStatus;
  ulong local_110;
  CompilationCompletionParallelTest *local_108;
  int fLengths [1];
  char *fSources [1];
  int vLengths [1];
  deUint32 fragmentShader [8];
  deUint32 program [8];
  char *vSources [1];
  Shader vertexShader;
  Functions *gl;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_parallel_shader_compile");
  if (bVar2) {
    local_108 = this;
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar3);
    (*gl->maxShaderCompilerThreadsARB)(8);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"maxShaderCompilerThreadsARB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x123);
    glu::Shader::Shader(&vertexShader,gl,SHADERTYPE_VERTEX);
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      GVar5 = (*gl->createShader)(0x8b30);
      fragmentShader[lVar7] = GVar5;
      GVar5 = (*gl->createProgram)();
      program[lVar7] = GVar5;
    }
    vSources[0] = 
    "#version 450\n\nin vec3 vertex;\n\nint main() {\n    gl_Position = vec4(vertex, 1);\n}\n";
    vLengths[0] = 0x51;
    glu::Shader::setSources(&vertexShader,1,vSources,vLengths);
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      fSources[0] = 
      "#version 450\n\nout ver4 fragColor;\n\nint main() {\n    fragColor = vec4(1, 1, 1, 1);\n}\n";
      fLengths[0] = 0x54;
      (*gl->shaderSource)(fragmentShader[lVar7],1,fSources,fLengths);
    }
    (*gl->compileShader)(vertexShader.m_shader);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"compileShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0x13d);
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      (*gl->compileShader)(fragmentShader[lVar7]);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"compileShader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0x141);
    }
    dVar6 = deGetMicroseconds();
    local_110 = dVar6 + 1000000;
    iVar3 = 0;
    while (uVar1 = local_110, iVar3 != 8) {
      dVar6 = deGetMicroseconds();
      if (uVar1 <= dVar6) {
        tcu::TestContext::setTestResult
                  ((local_108->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,
                   "Failed reading completion status for parallel shader compiling");
        for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
          (*gl->deleteProgram)(program[lVar7]);
          (*gl->deleteShader)(fragmentShader[lVar7]);
        }
        goto LAB_00ae5a8f;
      }
      iVar3 = 0;
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        (*gl->getShaderiv)(fragmentShader[lVar7],0x91b1,&completionStatus);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"getShaderiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                        ,0x14d);
        iVar3 = (iVar3 + 1) - (uint)(completionStatus == 0);
      }
    }
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      GVar5 = program[lVar7];
      (*gl->attachShader)(GVar5,vertexShader.m_shader);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"attachShader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0x162);
      (*gl->attachShader)(GVar5,fragmentShader[lVar7]);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"attachShader",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0x164);
    }
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      (*gl->linkProgram)(program[lVar7]);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"linkProgram",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0x16b);
    }
    dVar6 = deGetMicroseconds();
    local_110 = dVar6 + 1000000;
    iVar3 = 0;
    while (uVar1 = local_110, iVar3 != 8) {
      dVar6 = deGetMicroseconds();
      if (uVar1 <= dVar6) {
        tcu::TestContext::setTestResult
                  ((local_108->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,
                   "Failed reading completion status for parallel program linking");
        for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
          (*gl->deleteProgram)(program[lVar7]);
          (*gl->deleteShader)(fragmentShader[lVar7]);
        }
LAB_00ae5a8f:
        glu::Shader::~Shader(&vertexShader);
        return STOP;
      }
      iVar3 = 0;
      for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
        (*gl->getProgramiv)(program[lVar7],0x91b1,&completionStatus);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"getProgramiv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                        ,0x177);
        iVar3 = (iVar3 + 1) - (uint)(completionStatus == 0);
      }
    }
    glu::Shader::~Shader(&vertexShader);
    this_00 = (local_108->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CompilationCompletionParallelTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint completionStatus;

	gl.maxShaderCompilerThreadsARB(8);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	{
		Shader   vertexShader(gl, SHADERTYPE_VERTEX);
		deUint32 fragmentShader[8];
		deUint32 program[8];

		for (int i = 0; i < 8; ++i)
		{
			fragmentShader[i] = gl.createShader(GL_FRAGMENT_SHADER);
			program[i]		  = gl.createProgram();
		}

		const char* vSources[] = { vShader };
		const int   vLengths[] = { int(strlen(vShader)) };
		vertexShader.setSources(1, vSources, vLengths);

		//Compilation test
		for (int i = 0; i < 8; ++i)
		{
			const char* fSources[] = { fShader };
			const int   fLengths[] = { int(strlen(fShader)) };
			gl.shaderSource(fragmentShader[i], 1, fSources, fLengths);
		}

		gl.compileShader(vertexShader.getShader());
		GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");
		for (int i = 0; i < 8; ++i)
		{
			gl.compileShader(fragmentShader[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");
		}

		{
			int		 completion  = 0;
			deUint64 shLoopStart = deGetMicroseconds();
			while (completion != 8 && deGetMicroseconds() < shLoopStart + 1000000)
			{
				completion = 0;
				for (int i = 0; i < 8; ++i)
				{
					gl.getShaderiv(fragmentShader[i], GL_COMPLETION_STATUS_ARB, &completionStatus);
					GLU_EXPECT_NO_ERROR(gl.getError(), "getShaderiv");
					if (completionStatus)
						completion++;
				}
			}
			if (completion != 8)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
										"Failed reading completion status for parallel shader compiling");
				for (int i = 0; i < 8; ++i)
				{
					gl.deleteProgram(program[i]);
					gl.deleteShader(fragmentShader[i]);
				}
				return STOP;
			}
		}

		for (int i = 0; i < 8; ++i)
		{
			gl.attachShader(program[i], vertexShader.getShader());
			GLU_EXPECT_NO_ERROR(gl.getError(), "attachShader");
			gl.attachShader(program[i], fragmentShader[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "attachShader");
		}

		//Linking test
		for (int i = 0; i < 8; ++i)
		{
			gl.linkProgram(program[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "linkProgram");
		}

		{
			int		 completion  = 0;
			deUint64 prLoopStart = deGetMicroseconds();
			while (completion != 8 && deGetMicroseconds() < prLoopStart + 1000000)
			{
				completion = 0;
				for (int i = 0; i < 8; ++i)
				{
					gl.getProgramiv(program[i], GL_COMPLETION_STATUS_ARB, &completionStatus);
					GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramiv");
					if (completionStatus)
						completion++;
				}
			}
			if (completion != 8)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
										"Failed reading completion status for parallel program linking");
				for (int i = 0; i < 8; ++i)
				{
					gl.deleteProgram(program[i]);
					gl.deleteShader(fragmentShader[i]);
				}
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}